

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O1

void __thiscall
DisconnectedBlockTransactions::removeForBlock
          (DisconnectedBlockTransactions *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx)

{
  long lVar1;
  pointer psVar2;
  iterator __position;
  _List_node_base *p_Var3;
  const_iterator it_2;
  iterator __it;
  _List_node_base *p_Var4;
  long lVar5;
  ulong uVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  const_iterator it_1;
  _List_node_base *p_Var10;
  long lVar11;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar13;
  long in_FS_OFFSET;
  ulong uVar6;
  ulong uVar12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->queuedTx).
      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->queuedTx) {
    psVar13 = (vtx->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (vtx->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (psVar13 != psVar2) {
      uVar7 = 0;
      do {
        __it = std::
               _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->iters_by_txid)._M_h,
                      &(((psVar13->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->hash).m_wrapped);
        if (__it.
            super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          __position._M_node =
               *(_List_node_base **)
                ((long)__it.
                       super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
                       ._M_cur + 0x28);
          std::
          _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::erase(&(this->iters_by_txid)._M_h,
                  (const_iterator)
                  __it.
                  super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
                  ._M_cur);
          p_Var3 = __position._M_node[1]._M_next;
          if (p_Var3 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            p_Var4 = p_Var3[1]._M_prev;
            uVar9 = (long)p_Var3[2]._M_prev + (0x1f - (long)p_Var4) & 0xfffffffffffffff0;
            if (p_Var3[2]._M_prev == p_Var4) {
              uVar9 = uVar7;
            }
            p_Var8 = p_Var3->_M_next;
            uVar6 = (long)p_Var3[1]._M_next + (0x1f - (long)p_Var8) & 0xfffffffffffffff0;
            if (p_Var3[1]._M_next == p_Var8) {
              uVar6 = uVar7;
            }
            lVar5 = uVar6 + uVar9;
            for (; p_Var8 != p_Var3->_M_prev; p_Var8 = (_List_node_base *)&p_Var8[6]._M_prev) {
              p_Var10 = p_Var8[5]._M_next;
              uVar9 = (long)p_Var8[6]._M_next + (0x1f - (long)p_Var10) & 0xfffffffffffffff0;
              if (p_Var8[6]._M_next == p_Var10) {
                uVar9 = uVar7;
              }
              uVar6 = (ulong)*(uint *)&p_Var8[3]._M_next;
              if (*(uint *)((long)&p_Var8[4]._M_next + 4) < 0x1d) {
                uVar6 = uVar7;
              }
              uVar12 = uVar6 + 0x1f & 0x1fffffff0;
              if ((int)uVar6 == 0) {
                uVar12 = uVar7;
              }
              lVar11 = uVar12 + uVar9;
              for (; p_Var10 != p_Var8[5]._M_prev; p_Var10 = (_List_node_base *)&p_Var10[1]._M_prev)
              {
                uVar9 = 0;
                if (p_Var10[1]._M_next != p_Var10->_M_next) {
                  uVar9 = (long)p_Var10[1]._M_next + (0x1f - (long)p_Var10->_M_next) &
                          0xfffffffffffffff0;
                }
                lVar11 = lVar11 + uVar9;
              }
              lVar5 = lVar5 + lVar11;
            }
            for (; p_Var4 != p_Var3[2]._M_next; p_Var4 = (_List_node_base *)&p_Var4[2]._M_prev) {
              uVar9 = (ulong)*(uint *)&p_Var4[1]._M_next;
              if (*(uint *)((long)&p_Var4[2]._M_next + 4) < 0x1d) {
                uVar9 = uVar7;
              }
              uVar6 = 0;
              if ((int)uVar9 != 0) {
                uVar6 = uVar9 + 0x1f & 0x1fffffff0;
              }
              lVar5 = lVar5 + uVar6;
            }
            lVar5 = lVar5 + 0xc0;
          }
          this->cachedInnerUsage = this->cachedInnerUsage - lVar5;
          std::__cxx11::
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_erase(&this->queuedTx,__position);
        }
        psVar13 = psVar13 + 1;
      } while (psVar13 != psVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DisconnectedBlockTransactions::removeForBlock(const std::vector<CTransactionRef>& vtx)
{
    // Short-circuit in the common case of a block being added to the tip
    if (queuedTx.empty()) {
        return;
    }
    for (const auto& tx : vtx) {
        auto iter = iters_by_txid.find(tx->GetHash());
        if (iter != iters_by_txid.end()) {
            auto list_iter = iter->second;
            iters_by_txid.erase(iter);
            cachedInnerUsage -= RecursiveDynamicUsage(*list_iter);
            queuedTx.erase(list_iter);
        }
    }
}